

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

counting_iterator
fmt::v9::detail::write_codepoint<4ul,char,fmt::v9::detail::counting_iterator>
          (counting_iterator out,char prefix,uint32_t cp)

{
  counting_iterator cVar1;
  char local_45 [4];
  char cStack_41;
  char buf [4];
  counting_iterator cStack_40;
  value_type local_33;
  char local_32 [2];
  counting_iterator local_30;
  value_type local_22;
  char local_21;
  uint32_t local_20;
  char local_19;
  uint32_t cp_local;
  char prefix_local;
  counting_iterator out_local;
  
  local_21 = '\\';
  local_20 = cp;
  local_19 = prefix;
  _cp_local = out.count_;
  local_30 = counting_iterator::operator++((counting_iterator *)&cp_local,0);
  counting_iterator::operator*(&local_30);
  counting_iterator::value_type::operator=(&local_22,&local_21);
  local_32[0] = local_19;
  cStack_40 = counting_iterator::operator++((counting_iterator *)&cp_local,0);
  counting_iterator::operator*(&stack0xffffffffffffffc0);
  counting_iterator::value_type::operator=(&local_33,local_32);
  fill_n<char,unsigned_long>(local_45,4,'0');
  format_uint<4u,char,unsigned_int>(local_45,local_20,4,false);
  cVar1 = copy_str<char,char*,fmt::v9::detail::counting_iterator>(local_45,&cStack_41,_cp_local);
  return (counting_iterator)cVar1.count_;
}

Assistant:

auto write_codepoint(OutputIt out, char prefix, uint32_t cp) -> OutputIt {
  *out++ = static_cast<Char>('\\');
  *out++ = static_cast<Char>(prefix);
  Char buf[width];
  fill_n(buf, width, static_cast<Char>('0'));
  format_uint<4>(buf, cp, width);
  return copy_str<Char>(buf, buf + width, out);
}